

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superfamiconv.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  
  if (1 < argc) {
    __s1 = argv[1];
    iVar1 = strcmp(__s1,"palette");
    if (iVar1 == 0) {
      *__s1 = '\0';
      iVar1 = sfc_palette(argc,argv);
      return iVar1;
    }
    iVar1 = strcmp(__s1,"tiles");
    if (iVar1 == 0) {
      *__s1 = '\0';
      iVar1 = sfc_tiles(argc,argv);
      return iVar1;
    }
    iVar1 = strcmp(__s1,"map");
    if (iVar1 == 0) {
      *__s1 = '\0';
      iVar1 = sfc_map(argc,argv);
      return iVar1;
    }
  }
  iVar1 = superfamiconv(argc,argv);
  return iVar1;
}

Assistant:

int main(int argc, char* argv[]) {
  // If first argument is a subcommand, remove it and pass along
  if (argc > 1 && std::strcmp(argv[1], "palette") == 0) {
    std::strcpy(argv[1], "");
    return sfc_palette(argc, argv);

  } else if (argc > 1 && std::strcmp(argv[1], "tiles") == 0) {
    std::strcpy(argv[1], "");
    return sfc_tiles(argc, argv);

  } else if (argc > 1 && std::strcmp(argv[1], "map") == 0) {
    std::strcpy(argv[1], "");
    return sfc_map(argc, argv);

  } else {
    return superfamiconv(argc, argv);
  }
}